

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vgm_Emu_Impl.cpp
# Opt level: O2

int __thiscall Ym_Emu<Ym2413_Emu>::run_until(Ym_Emu<Ym2413_Emu> *this,int time)

{
  int iVar1;
  sample_t_conflict1 *psVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = this->last_time;
  iVar3 = 1;
  iVar4 = time - iVar1;
  if (iVar4 != 0 && iVar1 <= time) {
    if (iVar1 < 0) {
      iVar3 = 0;
    }
    else {
      this->last_time = time;
      psVar2 = this->out;
      this->out = psVar2 + (uint)(iVar4 * 2);
      Ym2413_Emu::run(&this->super_Ym2413_Emu,iVar4,psVar2);
    }
  }
  return iVar3;
}

Assistant:

inline int Ym_Emu<Emu>::run_until( int time )
{
	int count = time - last_time;
	if ( count > 0 )
	{
		if ( last_time < 0 )
			return false;
		last_time = time;
		short* p = out;
		out += count * Emu::out_chan_count;
		Emu::run( count, p );
	}
	return true;
}